

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereIndexExprTrans(Index *pIdx,int iTabCur,int iIdxCur,WhereInfo *pWInfo)

{
  ExprList *pEVar1;
  IdxExprTrans x;
  Walker w;
  ExprList *aColExpr;
  int iIdxCol;
  WhereInfo *pWInfo_local;
  int iIdxCur_local;
  int iTabCur_local;
  Index *pIdx_local;
  
  pEVar1 = pIdx->aColExpr;
  if (pEVar1 != (ExprList *)0x0) {
    memset(&x.iIdxCol,0,0x30);
    x.pIdxExpr._0_4_ = iTabCur;
    x.pIdxExpr._4_4_ = iIdxCur;
    for (aColExpr._4_4_ = 0; aColExpr._4_4_ < pEVar1->nExpr; aColExpr._4_4_ = aColExpr._4_4_ + 1) {
      if (pIdx->aiColumn[aColExpr._4_4_] == -2) {
        x.iTabCur = aColExpr._4_4_;
        sqlite3WalkExpr((Walker *)&x.iIdxCol,pWInfo->pWhere);
        sqlite3WalkExprList((Walker *)&x.iIdxCol,pWInfo->pOrderBy);
        sqlite3WalkExprList((Walker *)&x.iIdxCol,pWInfo->pResultSet);
      }
    }
  }
  return;
}

Assistant:

static void whereIndexExprTrans(
  Index *pIdx,      /* The Index */
  int iTabCur,      /* Cursor of the table that is being indexed */
  int iIdxCur,      /* Cursor of the index itself */
  WhereInfo *pWInfo /* Transform expressions in this WHERE clause */
){
  int iIdxCol;               /* Column number of the index */
  ExprList *aColExpr;        /* Expressions that are indexed */
  Walker w;
  IdxExprTrans x;
  aColExpr = pIdx->aColExpr;
  if( aColExpr==0 ) return;  /* Not an index on expressions */
  memset(&w, 0, sizeof(w));
  w.xExprCallback = whereIndexExprTransNode;
  w.u.pIdxTrans = &x;
  x.iTabCur = iTabCur;
  x.iIdxCur = iIdxCur;
  for(iIdxCol=0; iIdxCol<aColExpr->nExpr; iIdxCol++){
    if( pIdx->aiColumn[iIdxCol]!=XN_EXPR ) continue;
    assert( aColExpr->a[iIdxCol].pExpr!=0 );
    x.iIdxCol = iIdxCol;
    x.pIdxExpr = aColExpr->a[iIdxCol].pExpr;
    sqlite3WalkExpr(&w, pWInfo->pWhere);
    sqlite3WalkExprList(&w, pWInfo->pOrderBy);
    sqlite3WalkExprList(&w, pWInfo->pResultSet);
  }
}